

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressInRegister.cpp
# Opt level: O3

Expression * __thiscall IRT::AddressInRegister::ToExpression(AddressInRegister *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  TempExpression *this_00;
  Temporary local_38;
  
  this_00 = (TempExpression *)operator_new(0x28);
  paVar1 = &local_38.name_.field_2;
  pcVar2 = (this->temp_).name_._M_dataplus._M_p;
  local_38.name_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar2,pcVar2 + (this->temp_).name_._M_string_length);
  TempExpression::TempExpression(this_00,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.name_._M_dataplus._M_p != paVar1) {
    operator_delete(local_38.name_._M_dataplus._M_p,local_38.name_.field_2._M_allocated_capacity + 1
                   );
  }
  return &this_00->super_Expression;
}

Assistant:

Expression* AddressInRegister::ToExpression() {
  return new TempExpression(temp_);
}